

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_SetAssetIssuanceTest1_Test::TestBody
          (ConfidentialTransactionController_SetAssetIssuanceTest1_Test *this)

{
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  char *pcVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  AssertionResult gtest_ar_2;
  uint32_t retry_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  IssuanceParameter param;
  bool is_blind;
  ByteData256 contract_hash;
  Address token_address;
  Address asset_address;
  Amount token_amount;
  Amount asset_amount;
  Txid txid;
  ConfidentialTransactionController tx;
  ConfidentialTransactionController expect_tx;
  ConfidentialTransactionController tx_base;
  IssuanceParameter *pIVar5;
  IssuanceParameter *in_stack_fffffffffffff5a0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffff5b0;
  uint in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  IssuanceParameter *in_stack_fffffffffffff5c0;
  bool local_a01;
  AssertHelper local_970;
  Message local_968;
  string local_960 [32];
  string local_940 [32];
  AssertionResult local_920;
  string local_910 [32];
  string local_8f0 [32];
  AssertHelper local_8d0;
  Message local_8c8;
  ByteData local_8c0;
  undefined1 local_8a8 [56];
  undefined1 local_870 [80];
  Txid local_820 [3];
  uint local_7ac;
  AssertHelper local_7a8;
  Message local_7a0;
  string local_798 [32];
  AssertionResult local_778;
  AssertHelper local_768;
  Message local_760;
  string local_758 [32];
  string local_738 [32];
  AssertionResult local_718;
  AssertHelper local_708;
  Message local_700 [2];
  ByteData local_6f0;
  undefined1 local_6d8 [56];
  undefined1 local_6a0 [80];
  Txid local_650 [7];
  byte local_569;
  undefined1 local_568 [55];
  allocator local_531;
  string local_530 [32];
  Address local_510 [376];
  vector local_398 [31];
  allocator local_379;
  string local_378 [32];
  Address local_358 [376];
  _func_int **local_1e0;
  undefined1 local_1d8;
  undefined1 local_1d0 [40];
  undefined1 local_1a8;
  allocator local_199;
  string local_198 [32];
  Txid local_178;
  ConfidentialTransactionController local_158;
  allocator local_101;
  string local_100 [32];
  ConfidentialTransactionController local_e0;
  allocator local_79;
  string local_78 [32];
  ConfidentialTransactionController local_58;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,&local_79);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_58,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_100,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,&local_101);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_e0,local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_158,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_198,"c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f",&local_199
            );
  cfd::core::Txid::Txid(&local_178,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_1d0._16_8_ = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_1d0[0x18] = extraout_DL;
  local_1d0._32_8_ = local_1d0._16_8_;
  local_1a8 = extraout_DL;
  local_1e0 = (_func_int **)cfd::core::Amount::CreateByCoinAmount(10.0);
  local_1d8 = extraout_DL_00;
  local_1d0._0_8_ = local_1e0;
  local_1d0[8] = extraout_DL_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",&local_379);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_358,local_378,local_398);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (in_stack_fffffffffffff5b0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG",&local_531);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_510,local_530,(vector *)(local_568 + 0x18));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (in_stack_fffffffffffff5b0);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_568);
  local_569 = 0;
  cfd::core::IssuanceParameter::IssuanceParameter(in_stack_fffffffffffff5c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::GetLockingScript();
      cfd::core::ByteData::ByteData((ByteData *)local_6a0);
      cfd::core::Address::GetLockingScript();
      cfd::core::ByteData::ByteData(&local_6f0);
      in_stack_fffffffffffff5c0 = (IssuanceParameter *)local_568;
      in_stack_fffffffffffff5b8 = local_569 & 1;
      in_stack_fffffffffffff5a0 = (IssuanceParameter *)local_1d0;
      pIVar5 = (IssuanceParameter *)local_6a0;
      cfd::ConfidentialTransactionController::SetAssetIssuance
                (local_650,(uint)&local_158,(Amount *)&local_178,(Script *)0x1,
                 (ByteData *)(local_1d0 + 0x20),(Amount *)(local_6a0 + 0x18),(Script *)pIVar5,
                 (ByteData *)in_stack_fffffffffffff5a0,SUB81(local_6d8,0),(ByteData256 *)&local_6f0,
                 SUB41(in_stack_fffffffffffff5b8,0),SUB81(in_stack_fffffffffffff5c0,0));
      cfd::core::IssuanceParameter::operator=(in_stack_fffffffffffff5a0,pIVar5);
      cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff5a0);
      cfd::core::ByteData::~ByteData((ByteData *)0x1c7b1b);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff5a0);
      cfd::core::ByteData::~ByteData((ByteData *)0x1c7b35);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff5a0);
    }
  }
  else {
    testing::Message::Message(local_700);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x4d,
               "Expected: (param = tx.SetAssetIssuance(txid, 1, asset_amount, asset_address.GetLockingScript(), ByteData(), token_amount, token_address.GetLockingScript(), ByteData(), is_blind, contract_hash, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_708,local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    testing::Message::~Message((Message *)0x1c7ed1);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_718,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar3,pcVar4
            );
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_718);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1c8054);
    testing::internal::AssertHelper::AssertHelper
              (&local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_768,&local_760);
    testing::internal::AssertHelper::~AssertHelper(&local_768);
    testing::Message::~Message((Message *)0x1c80b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c810f);
  cfd::core::BlindFactor::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_778,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",pcVar3,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string(local_798);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1c81fc);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    testing::Message::~Message((Message *)0x1c8259);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c82b1);
  local_7ac = 0;
  do {
    cfd::ConfidentialTransactionController::operator=(&local_158,&local_58);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Address::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)local_870);
        cfd::core::Address::GetLockingScript();
        cfd::core::ByteData::ByteData(&local_8c0);
        in_stack_fffffffffffff5c0 = (IssuanceParameter *)local_568;
        in_stack_fffffffffffff5b8 = local_569 & 1;
        in_stack_fffffffffffff5a0 = (IssuanceParameter *)local_1d0;
        cfd::ConfidentialTransactionController::SetAssetIssuance
                  (local_820,(uint)&local_158,(Amount *)&local_178,(Script *)0x1,
                   (ByteData *)(local_1d0 + 0x20),(Amount *)(local_870 + 0x18),(Script *)local_870,
                   (ByteData *)in_stack_fffffffffffff5a0,SUB81(local_8a8,0),
                   (ByteData256 *)&local_8c0,SUB41(in_stack_fffffffffffff5b8,0),
                   SUB81(in_stack_fffffffffffff5c0,0));
        cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff5a0);
        cfd::core::ByteData::~ByteData((ByteData *)0x1c83fc);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff5a0);
        cfd::core::ByteData::~ByteData((ByteData *)0x1c8416);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff5a0);
      }
    }
    else {
      testing::Message::Message(&local_8c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_8d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
                 ,0x5d,
                 "Expected: (tx.SetAssetIssuance(txid, 1, asset_amount, asset_address.GetLockingScript(), ByteData(), token_amount, token_address.GetLockingScript(), ByteData(), is_blind, contract_hash, true)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
      testing::internal::AssertHelper::~AssertHelper(&local_8d0);
      testing::Message::~Message((Message *)0x1c856e);
    }
    local_7ac = local_7ac + 1;
    cfd::AbstractTransactionController::GetHex_abi_cxx11_();
    cfd::AbstractTransactionController::GetHex_abi_cxx11_();
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff5c0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
    local_a01 = _Var2 && local_7ac < 10;
    std::__cxx11::string::~string(local_910);
    std::__cxx11::string::~string(local_8f0);
  } while (local_a01);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTRNE
            ((internal *)&local_920,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar3,pcVar4
            );
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_920);
  if (!bVar1) {
    testing::Message::Message(&local_968);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1c87ae);
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    testing::Message::~Message((Message *)0x1c880b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8860);
  cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff5a0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x1c887a);
  cfd::core::Address::~Address((Address *)in_stack_fffffffffffff5a0);
  cfd::core::Address::~Address((Address *)in_stack_fffffffffffff5a0);
  cfd::core::Txid::~Txid((Txid *)0x1c88a1);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffff5a0);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffff5a0);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffff5a0);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, SetAssetIssuanceTest1)
{
  ConfidentialTransactionController tx_base(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransactionController expect_tx(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000");

  // not blind
  ConfidentialTransactionController tx(tx_base);
  Txid txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f");
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  Address asset_address("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z", cfd::core::GetElementsAddressFormatList());
  Address token_address("2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG", cfd::core::GetElementsAddressFormatList());
  ByteData256 contract_hash;
  bool is_blind = false;
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(txid, 1, asset_amount,
                                   asset_address.GetLockingScript(),
                                   ByteData(), token_amount,
                                   token_address.GetLockingScript(),
                                   ByteData(), is_blind,
                                   contract_hash, false)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // txout randomize
  uint32_t retry_count = 0;
  do {
    tx = tx_base;
    EXPECT_NO_THROW(
        (tx.SetAssetIssuance(txid, 1, asset_amount,
                             asset_address.GetLockingScript(),
                             ByteData(), token_amount,
                             token_address.GetLockingScript(),
                             ByteData(), is_blind,
                             contract_hash, true)));
    ++retry_count;
  } while ((tx.GetHex() == expect_tx.GetHex()) && (retry_count < 10));
  EXPECT_STRNE(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}